

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,absl::lts_20240722::hash_internal::Hash<std::pair<int,int>>,std::equal_to<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
::find_or_prepare_insert_soo<std::pair<int,int>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,absl::lts_20240722::hash_internal::Hash<std::pair<int,int>>,std::equal_to<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
          *this,pair<int,_int> *key)

{
  pair<int,_int> *key_1;
  slot_type *psVar1;
  size_t sVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  iterator iVar7;
  
  if (*(ulong *)(this + 8) < 2) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    ::try_sample_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                      *)this);
    CommonFields::set_full_soo((CommonFields *)this);
    iVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
            ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                            *)this);
  }
  else {
    psVar1 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
             ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                         *)this);
    iVar5 = -(uint)((*key).first == (psVar1->value).first.first);
    iVar6 = -(uint)((*key).second == (psVar1->value).first.second);
    auVar4._4_4_ = iVar5;
    auVar4._0_4_ = iVar5;
    auVar4._8_4_ = iVar6;
    auVar4._12_4_ = iVar6;
    iVar5 = movmskpd((int)psVar1,auVar4);
    if (iVar5 == 3) {
      iVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
              ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                              *)this);
      bVar3 = false;
      goto LAB_002e33d4;
    }
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    ::resize_impl(this,3);
    sVar2 = hash_internal::MixingHashState::hash<std::pair<int,_int>,_0>(key);
    sVar2 = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                      (sVar2,0xc,(CommonFields *)this);
    iVar7 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
            ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                           *)this,sVar2);
  }
  bVar3 = true;
LAB_002e33d4:
  __return_storage_ptr__->first = iVar7;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }